

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void stat4Destructor(void *pOld)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)((long)pOld + 8); lVar2 = lVar2 + 1) {
    sampleClear(*(sqlite3 **)((long)pOld + 0x70),
                (Stat4Sample *)(*(long *)((long)pOld + 0x50) + lVar1));
    lVar1 = lVar1 + 0x30;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)((long)pOld + 0x10); lVar2 = lVar2 + 1) {
    sampleClear(*(sqlite3 **)((long)pOld + 0x70),
                (Stat4Sample *)(*(long *)((long)pOld + 0x68) + lVar1));
    lVar1 = lVar1 + 0x30;
  }
  sampleClear(*(sqlite3 **)((long)pOld + 0x70),(Stat4Sample *)((long)pOld + 0x18));
  sqlite3DbFree(*(sqlite3 **)((long)pOld + 0x70),pOld);
  return;
}

Assistant:

static void stat4Destructor(void *pOld){
  Stat4Accum *p = (Stat4Accum*)pOld;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int i;
  for(i=0; i<p->nCol; i++) sampleClear(p->db, p->aBest+i);
  for(i=0; i<p->mxSample; i++) sampleClear(p->db, p->a+i);
  sampleClear(p->db, &p->current);
#endif
  sqlite3DbFree(p->db, p);
}